

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,int *iRow,int *hint)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  undefined1 auVar9 [8];
  pointer ppVar10;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar11;
  HVector *vec;
  HVector *pHVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  long lVar16;
  pointer pdVar17;
  pointer __src;
  pointer piVar18;
  size_t sVar19;
  pointer piVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  pointer piVar24;
  value_type *__x;
  long lVar25;
  vector<int,_std::allocator<int>_> *pvVar26;
  int i_3;
  size_type __new_size;
  int i_1;
  int iVar27;
  long lVar28;
  double dVar29;
  bool bVar30;
  undefined8 uStack_180;
  long alStack_178 [3];
  vector<int,_std::allocator<int>_> *local_160;
  vector<int,_std::allocator<int>_> *local_158;
  vector<double,_std::allocator<double>_> *local_150;
  undefined1 auStack_148 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  int local_114;
  double local_110;
  long local_108;
  long local_100;
  double local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<int,_std::allocator<int>_> *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  undefined8 uStack_d0;
  long local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  ulong local_b0;
  pointer local_a8;
  ulong uStack_a0;
  int local_94;
  HFactor *pHStack_90;
  int UendX;
  vector<double,_std::allocator<double>_> *local_88;
  int *local_80;
  long local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  int local_44;
  vector<int,_std::allocator<int>_> *pvStack_40;
  int index_1;
  pair<int,_int> local_38;
  int index;
  
  local_80 = iRow;
  local_60 = 0.0;
  pHVar12 = aq;
  while (pHVar12 != (HVector *)0x0) {
    pHVar12 = pHVar12->next;
    local_60 = (double)((long)local_60 + 1);
  }
  uVar13 = (long)local_60 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar16 = (long)alStack_178 - uVar13;
  lVar14 = lVar16 - uVar13;
  local_68 = (vector<double,_std::allocator<double>_> *)lVar14;
  for (dVar15 = 0.0; local_60 != dVar15; dVar15 = (double)((long)dVar15 + 1)) {
    *(HVector **)(lVar16 + (long)dVar15 * 8) = aq;
    *(HVector **)(lVar14 + (long)dVar15 * 8) = ep;
    aq = aq->next;
    ep = ep->next;
  }
  local_160 = &this->PFpivotIndex;
  piVar24 = (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar20 = (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar14 = lVar14 - ((long)local_60 * 4 + 0xfU & 0xfffffffffffffff0);
  local_108 = lVar14;
  local_78 = lVar14 - uVar13;
  lVar28 = (lVar14 - uVar13) - uVar13;
  piVar3 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar17 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_150 = &this->UpivotValue;
  lVar25 = 0;
  dVar15 = local_60;
  while (bVar30 = dVar15 != 0.0, dVar15 = (double)((long)dVar15 + -1), bVar30) {
    iVar11 = local_80[lVar25];
    iVar27 = piVar3[iVar11];
    *(int *)(lVar14 + lVar25 * 4) = iVar27;
    *(double *)(local_78 + lVar25 * 8) = pdVar17[iVar27];
    *(undefined8 *)(lVar28 + lVar25 * 8) =
         *(undefined8 *)(*(long *)(*(long *)(lVar16 + lVar25 * 8) + 0x20) + (long)iVar11 * 8);
    lVar25 = lVar25 + 1;
  }
  alStack_178[1] = lVar28;
  uVar23 = (long)local_60 * 4 + 0x13U & 0xfffffffffffffff0;
  local_c0 = lVar28 - uVar23;
  lVar14 = local_c0 - uVar13;
  local_100 = lVar14;
  this_00 = &this->Uindex;
  local_b0 = (ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  *(int *)(lVar28 - uVar23) = (int)local_b0;
  auStack_148 = (undefined1  [8])0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvStack_40 = &this->iwork;
  local_158 = &this->PFstart;
  local_70 = &this->PFindex;
  local_88 = &this->PFvalue;
  this_01 = &this->Uvalue;
  local_e0 = (vector<int,_std::allocator<int>_> *)
             (long)(int)((ulong)((long)piVar24 - (long)piVar20) >> 2);
  pHStack_90 = this;
  alStack_178[2] = lVar16;
  for (dVar15 = 0.0; local_60 != dVar15; dVar15 = (double)((long)dVar15 + 1)) {
    piVar24 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != piVar24) {
      (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar24;
    }
    lVar16 = *(long *)(lVar16 + (long)dVar15 * 8);
    for (lVar25 = 0; pvVar26 = pvStack_40, pvVar7 = local_e0, lVar25 < *(int *)(lVar16 + 0x84);
        lVar25 = lVar25 + 1) {
      local_38.first = *(int *)(*(long *)(lVar16 + 0x88) + lVar25 * 4);
      local_58 = *(double *)(*(long *)(lVar16 + 0xa0) + lVar25 * 8);
      *(undefined8 *)(lVar14 + -8) = 0x12815a;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar26,&local_38.first);
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_38.first] = local_58;
    }
    for (dVar29 = 0.0; pvVar26 = pvStack_40, lVar16 = local_100, dVar29 != dVar15;
        dVar29 = (double)((long)dVar29 + 1)) {
      local_38.first = local_80[(long)dVar29];
      pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_58 = pdVar17[local_80[(long)dVar29]];
      piVar24 = (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar16 = (long)piVar24[(long)dVar29 + (long)pvVar7];
          lVar16 < piVar24[(long)dVar29 + (long)pvVar7 + 1]; lVar16 = lVar16 + 1) {
        local_58 = local_58 -
                   pdVar17[(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]] *
                   (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
      }
      *(undefined8 *)(lVar14 + -8) = 0x1281fb;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar26,&local_38.first);
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_38.first] = local_58;
    }
    local_b8 = (vector<int,_std::allocator<int>_> *)(local_80 + (long)dVar15);
    pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_f8 = pdVar17[*(int *)local_b8];
    pdVar17[*(int *)local_b8] = 0.0;
    local_f0 = (vector<int,_std::allocator<int>_> *)(long)*(int *)(local_c0 + (long)dVar15 * 4);
    uVar21 = 0;
    while( true ) {
      piVar24 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar20 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)piVar20 - (long)piVar24 >> 2) <= (ulong)uVar21) break;
      local_44 = piVar24[uVar21];
      pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = *(pair<int,_int> *)(pdVar17 + local_44);
      pdVar17[local_44] = 0.0;
      if (1e-14 < ABS((double)local_38)) {
        *(undefined8 *)(lVar14 + -8) = 0x1282b7;
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_44);
        *(undefined8 *)(lVar14 + -8) = 0x1282c6;
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_01,(value_type_conflict1 *)&local_38);
      }
      uVar21 = uVar21 + 1;
    }
    local_e8 = (vector<int,_std::allocator<int>_> *)
               ((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
    *(int *)(local_c0 + 4 + (long)dVar15 * 4) = (int)local_e8;
    local_a8 = *(pointer *)(local_78 + (long)dVar15 * 8);
    uStack_a0 = 0;
    *(double *)(lVar16 + (long)dVar15 * 8) =
         *(double *)(alStack_178[1] + (long)dVar15 * 8) * (double)local_a8;
    if (piVar20 != piVar24) {
      (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar24;
    }
    lVar16 = *(long *)((long)local_68 + (long)dVar15 * 8);
    for (lVar25 = 0; pvVar7 = pvStack_40, lVar25 < *(int *)(lVar16 + 0x84); lVar25 = lVar25 + 1) {
      local_38.first = *(int *)(*(long *)(lVar16 + 0x88) + lVar25 * 4);
      local_58 = *(double *)(*(long *)(lVar16 + 0xa0) + lVar25 * 8);
      *(undefined8 *)(lVar14 + -8) = 0x128367;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_38.first);
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_38.first] = local_58;
    }
    local_110 = dVar15;
    for (dVar29 = 0.0; lVar16 = local_100, dVar29 != dVar15; dVar29 = (double)((long)dVar29 + 1)) {
      lVar16 = (long)((pointer)((long)auStack_148 + dVar29 * 8))->second;
      iVar11 = local_80[lVar16];
      pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (1e-14 < ABS(pdVar17[iVar11])) {
        local_d8 = (vector<int,_std::allocator<int>_> *)
                   (pdVar17[iVar11] * -*(double *)(local_78 + lVar16 * 8));
        lVar16 = *(long *)((long)local_68 + lVar16 * 8);
        uStack_d0 = 0;
        for (lVar25 = 0; pvVar7 = pvStack_40, lVar25 < *(int *)(lVar16 + 0x84); lVar25 = lVar25 + 1)
        {
          local_38.first = *(int *)(*(long *)(lVar16 + 0x88) + lVar25 * 4);
          local_58 = *(double *)(*(long *)(lVar16 + 0xa0) + lVar25 * 8);
          *(undefined8 *)(lVar14 + -8) = 0x12842a;
          std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_38.first);
          pdVar17 = (pHStack_90->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar17[local_38.first] = local_58 * (double)local_d8 + pdVar17[local_38.first];
        }
        pdVar17 = (pHStack_90->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        this = pHStack_90;
        dVar15 = local_110;
      }
      pdVar17[iVar11] = 0.0;
    }
    dVar29 = 0.0;
    while (pvVar26 = pvStack_40, pvVar7 = local_b8, dVar29 != dVar15) {
      local_38.first = local_80[(long)dVar29];
      pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_58 = pdVar17[local_80[(long)dVar29]];
      for (lVar25 = (long)*(int *)(local_c0 + (long)dVar29 * 4);
          lVar25 < *(int *)(local_c0 + 4 + (long)dVar29 * 4); lVar25 = lVar25 + 1) {
        local_58 = local_58 -
                   pdVar17[(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar25]] *
                   (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar25];
      }
      local_d8 = *(vector<int,_std::allocator<int>_> **)(lVar16 + (long)dVar29 * 8);
      *(undefined8 *)(lVar14 + -8) = 0x128501;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar26,&local_38.first);
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_38.first] = local_58 / (double)local_d8;
      dVar29 = (double)((long)dVar29 + 1);
    }
    pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar29 = 0.0;
    for (pvVar26 = local_f0; (long)pvVar26 < (long)(int)local_e8;
        pvVar26 = (vector<int,_std::allocator<int>_> *)((long)pvVar26 + 1)) {
      dVar29 = dVar29 + pdVar17[(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start[(long)pvVar26]] *
                        (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)pvVar26];
    }
    *(double *)(lVar16 + (long)dVar15 * 8) = dVar29 * (double)local_a8 + local_f8;
    pdVar17[*(int *)local_b8] = 0.0;
    local_a8 = (pointer)((ulong)local_a8 ^ 0x8000000000000000);
    uStack_a0 = uStack_a0 ^ 0x8000000000000000;
    uVar21 = 0;
    while( true ) {
      this_02 = local_70;
      pvVar26 = local_160;
      piVar24 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar24 >> 2) <= (ulong)uVar21)
      break;
      local_44 = piVar24[uVar21];
      pdVar17 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_58 = pdVar17[local_44];
      pdVar17[local_44] = 0.0;
      uStack_50 = 0;
      if (1e-14 < ABS(local_58)) {
        *(undefined8 *)(lVar14 + -8) = 0x1285f7;
        std::vector<int,_std::allocator<int>_>::push_back(this_02,&local_44);
        pvVar8 = local_88;
        local_38 = (pair<int,_int>)(local_58 * (double)local_a8);
        *(undefined8 *)(lVar14 + -8) = 0x128615;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (pvVar8,(double *)&local_38);
      }
      uVar21 = uVar21 + 1;
    }
    *(undefined8 *)(lVar14 + -8) = 0x128629;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar26,(value_type *)pvVar7);
    pvVar7 = local_158;
    lVar16 = alStack_178[2];
    piVar24 = (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar11 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    this->FtotalX = (this->FtotalX - piVar24[-1]) + iVar11 + 1;
    this->UtotalX = this->UtotalX + (iVar11 - piVar24[-1]);
    local_38.first = iVar11;
    *(undefined8 *)(lVar14 + -8) = 0x12867c;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar7,&local_38.first);
    local_38 = (pair<int,_int>)
               ((long)dVar15 << 0x20 | (ulong)*(uint *)(local_108 + (long)dVar15 * 4));
    *(undefined8 *)(lVar14 + -8) = 0x1286a4;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)auStack_148,
               &local_38);
    ppVar10 = sorted_pp.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    auVar9 = auStack_148;
    *(undefined8 *)(lVar14 + -8) = 0x1286b7;
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar9,ppVar10);
  }
  local_88 = (vector<double,_std::allocator<double>_> *)&this->URlastp;
  local_70 = &this->URstart;
  local_d8 = &this->URindex;
  local_f0 = &this->Ustart;
  local_e8 = &this->Ulastp;
  local_b8 = &this->URspace;
  local_68 = &this->URvalue;
  local_e0 = &this->UpivotIndex;
  dVar15 = 0.0;
  do {
    if (local_60 == dVar15) {
      *(undefined8 *)(lVar14 + -8) = 0x128c11;
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 auStack_148);
      return;
    }
    iVar11 = local_80[(long)dVar15];
    local_38.first = iVar11;
    pvStack_40 = (vector<int,_std::allocator<int>_> *)(long)*(int *)(local_108 + (long)dVar15 * 4);
    piVar18 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    this->FtotalX = this->FtotalX + (local_a8[(long)pvStack_40] - piVar18[(long)pvStack_40]);
    this->UtotalX = this->UtotalX + (local_a8[(long)pvStack_40] - piVar18[(long)pvStack_40]);
    piVar24 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar20 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar17 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar16 = (long)local_a8[(long)pvStack_40]; lVar16 < piVar18[(long)pvStack_40];
        lVar16 = lVar16 + 1) {
      iVar27 = piVar20[piVar24[lVar16]];
      iVar2 = piVar3[iVar27];
      lVar28 = (long)iVar2;
      iVar22 = piVar4[iVar27];
      lVar25 = (long)iVar22;
      piVar4[iVar27] = iVar22 + -1;
      if (iVar22 < iVar2) {
        iVar22 = iVar2;
      }
      for (; lVar28 < lVar25; lVar28 = lVar28 + 1) {
        if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[lVar28] == iVar11) {
          iVar22 = (int)lVar28;
          break;
        }
      }
      piVar5[iVar22] = piVar5[lVar25 + -1];
      pdVar17[iVar22] = pdVar17[lVar25 + -1];
      this = pHStack_90;
    }
    piVar24 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar20 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->FtotalX = this->FtotalX + (piVar20[(long)pvStack_40] - piVar24[(long)pvStack_40]);
    this->UtotalX = this->UtotalX + (piVar20[(long)pvStack_40] - piVar24[(long)pvStack_40]);
    piVar4 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar17 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar16 = (long)piVar20[(long)pvStack_40]; lVar16 < piVar24[(long)pvStack_40];
        lVar16 = lVar16 + 1) {
      iVar27 = piVar3[piVar4[lVar16]];
      iVar2 = local_a8[iVar27];
      lVar28 = (long)iVar2;
      iVar22 = piVar18[iVar27];
      lVar25 = (long)iVar22;
      piVar18[iVar27] = iVar22 + -1;
      if (iVar22 < iVar2) {
        iVar22 = iVar2;
      }
      for (; lVar28 < lVar25; lVar28 = lVar28 + 1) {
        if ((local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar28] == iVar11) {
          iVar22 = (int)lVar28;
          break;
        }
      }
      piVar1 = piVar5 + iVar27;
      *piVar1 = *piVar1 + 1;
      piVar6[iVar22] = piVar6[lVar25 + -1];
      pdVar17[iVar22] = pdVar17[lVar25 + -1];
      this = pHStack_90;
    }
    local_44 = (int)local_b0;
    local_94 = *(int *)(local_c0 + 4 + (long)dVar15 * 4);
    this->FtotalX = this->FtotalX + (local_94 - local_44) + 1;
    this->UtotalX = this->UtotalX + (local_94 - local_44);
    local_f8 = (double)((long)dVar15 + 1);
    local_b0 = CONCAT44(local_b0._4_4_,local_94);
    local_58 = dVar15;
    for (dVar29 = (double)(long)local_44; pvVar26 = local_d8, pvVar7 = local_f0,
        (long)dVar29 < (long)local_94; dVar29 = (double)((long)dVar29 + 1)) {
      iVar11 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)dVar29]];
      piVar24 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar27 = piVar24[iVar11];
      piVar20 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (iVar27 == 0) {
        piVar1 = local_a8 + iVar11;
        local_a8 = (pointer)(long)*piVar1;
        local_78 = (long)piVar18[iVar11];
        iVar22 = piVar18[iVar11] - *piVar1;
        iVar27 = (int)((double)iVar22 * 1.1 + 5.0);
        iVar2 = (int)((ulong)((long)(this->URindex).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar20) >> 2)
        ;
        __new_size = (size_type)(iVar2 + iVar27);
        local_110 = dVar29;
        *(undefined8 *)(lVar14 + -8) = 0x128a0d;
        std::vector<int,_std::allocator<int>_>::resize(pvVar26,__new_size);
        pvVar8 = local_68;
        *(undefined8 *)(lVar14 + -8) = 0x128a19;
        std::vector<double,_std::allocator<double>_>::resize(pvVar8,__new_size);
        sVar19 = local_78 * 4 + (long)local_a8 * -4;
        if (sVar19 != 0) {
          piVar24 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar20 = piVar24 + (long)local_a8;
          *(undefined8 *)(lVar14 + -8) = 0x128a52;
          memmove(piVar24 + iVar2,piVar20,sVar19);
        }
        sVar19 = local_78 * 8 + (long)local_a8 * -8;
        if (sVar19 != 0) {
          pdVar17 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          __src = pdVar17 + (long)local_a8;
          *(undefined8 *)(lVar14 + -8) = 0x128a83;
          memmove(pdVar17 + iVar2,__src,sVar19);
        }
        local_a8 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_a8[iVar11] = iVar2;
        piVar18 = (((_Vector_base<int,_std::allocator<int>_> *)
                   &local_88->super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                  super__Vector_impl_data._M_start;
        piVar18[iVar11] = iVar22 + iVar2;
        iVar27 = iVar27 - iVar22;
        piVar24 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar24[iVar11] = iVar27;
        piVar20 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar29 = local_110;
        this = pHStack_90;
        dVar15 = local_58;
      }
      piVar24[iVar11] = iVar27 + -1;
      iVar27 = piVar18[iVar11];
      piVar18[iVar11] = iVar27 + 1;
      piVar20[iVar27] = local_38.first;
      (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[iVar27] =
           (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)dVar29];
    }
    *(undefined8 *)(lVar14 + -8) = 0x128b23;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_44);
    pvVar7 = local_e8;
    lVar16 = local_100;
    *(undefined8 *)(lVar14 + -8) = 0x128b3d;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_94);
    pvVar26 = pvStack_40;
    pvVar7 = local_70;
    __x = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start + (long)pvStack_40;
    *(undefined8 *)(lVar14 + -8) = 0x128b58;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,__x);
    pvVar8 = local_88;
    piVar24 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined8 *)(lVar14 + -8) = 0x128b6b;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)pvVar8,piVar24 + (long)pvVar26);
    pvVar26 = pvStack_40;
    pvVar7 = local_b8;
    local_114 = ((((_Vector_base<int,_std::allocator<int>_> *)
                  &local_88->super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                 super__Vector_impl_data._M_start[(long)pvStack_40] +
                (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)pvStack_40]) -
                (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)pvStack_40];
    *(undefined8 *)(lVar14 + -8) = 0x128ba2;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar7,&local_114);
    pvVar7 = local_e0;
    piVar24 = (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_38.first] =
         (int)((ulong)((long)(this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar24) >> 2);
    piVar24[(long)pvVar26] = -1;
    *(undefined8 *)(lVar14 + -8) = 0x128bdc;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,&local_38.first);
    pvVar8 = local_150;
    *(undefined8 *)(lVar14 + -8) = 0x128bec;
    std::vector<double,_std::allocator<double>_>::push_back
              (pvVar8,(value_type_conflict1 *)(lVar16 + (long)dVar15 * 8));
    local_b0 = local_b0 & 0xffffffff;
    dVar15 = local_f8;
  } while( true );
}

Assistant:

void HFactor::updateCFT(HVector *aq, HVector *ep, int *iRow, int *hint) {

    /*
     * In the major update loop, the prefix
     *
     * c(p) = current working pivot
     * p(p) = previous pivot  (0 =< pp < cp)
     */

    int numUpdate = 0;
    for (HVector *vec = aq; vec != 0; vec = vec->next)
        numUpdate++;

    HVector* aqWork[numUpdate];
    HVector* epWork[numUpdate];

    for (int i = 0; i < numUpdate; i++) {
        aqWork[i] = aq;
        epWork[i] = ep;
        aq = aq->next;
        ep = ep->next;
    }

    // Pivot related buffers
    int PFnp0 = PFpivotIndex.size();
    int pLogic[numUpdate];
    double pValue[numUpdate];
    double pAlpha[numUpdate];
    for (int cp = 0; cp < numUpdate; cp++) {
        int cRow = iRow[cp];
        int iLogic = UpivotLookup[cRow];
        pLogic[cp] = iLogic;
        pValue[cp] = UpivotValue[iLogic];
        pAlpha[cp] = aqWork[cp]->array[cRow];
    }

    // Temporary U pointers
    int Tstart[numUpdate + 1];
    double Tpivot[numUpdate];
    Tstart[0] = Uindex.size();

    // Logically sorted previous row_ep
    vector<pair<int, int> > sorted_pp;

    // Major update loop
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Expand partial FTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < aqWork[cp]->packCount; i++) {
            int index = aqWork[cp]->packIndex[i];
            double value = aqWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 2. Update partial FTRAN result by recent FT matrix
        for (int pp = 0; pp < cp; pp++) {
            int pRow = iRow[pp];
            double value = dwork[pRow];
            int PFpp = pp + PFnp0;
            for (int i = PFstart[PFpp]; i < PFstart[PFpp + 1]; i++)
                value -= dwork[PFindex[i]] * PFvalue[i];
            iwork.push_back(pRow); // OK to duplicate
            dwork[pRow] = value;
        }

        // 3. Store the partial FTRAN result to matirx U
        double ppaq = dwork[iRow[cp]]; // pivot of the partial aq
        dwork[iRow[cp]] = 0;
        int UcountX = Tstart[cp];
        int UstartX = UcountX;
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0; // This effectively removes all duplication
            if (fabs(value) > HSOL_CONST_TINY) {
                Uindex.push_back(index);
                Uvalue.push_back(value);
            }
        }
        UcountX = Uindex.size();
        Tstart[cp + 1] = UcountX;
        Tpivot[cp] = pValue[cp] * pAlpha[cp];

        // 4. Expand partial BTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < epWork[cp]->packCount; i++) {
            int index = epWork[cp]->packIndex[i];
            double value = epWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 5. Delete logical later rows (in logical order)
        for (int isort = 0; isort < cp; isort++) {
            int pp = sorted_pp[isort].second;
            int pRow = iRow[pp];
            double multiplier = -pValue[pp] * dwork[pRow];
            if (fabs(dwork[pRow]) > HSOL_CONST_TINY) {
                for (int i = 0; i < epWork[pp]->packCount; i++) {
                    int index = epWork[pp]->packIndex[i];
                    double value = epWork[pp]->packValue[i];
                    iwork.push_back(index);
                    dwork[index] += value * multiplier;
                }
            }
            dwork[pRow] = 0; // Force to be 0
        }

        // 6. Update partial BTRAN result by recent U columns
        for (int pp = 0; pp < cp; pp++) {
            int kpivot = iRow[pp];
            double value = dwork[kpivot];
            for (int k = Tstart[pp]; k < Tstart[pp + 1]; k++)
                value -= dwork[Uindex[k]] * Uvalue[k];
            value /= Tpivot[pp];
            iwork.push_back(kpivot);
            dwork[kpivot] = value; // Again OK to duplicate
        }

        // 6.x compute current alpha
        double thex = 0;
        for (int k = UstartX; k < UcountX; k++) {
            int index = Uindex[k];
            double value = Uvalue[k];
            thex += dwork[index] * value;
        }
        Tpivot[cp] = ppaq + thex * pValue[cp];

        // 7. Store BTRAN result to FT elimination, update logic helper
        dwork[iRow[cp]] = 0;
        double pivotX = -pValue[cp];
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0;
            if (fabs(value) > HSOL_CONST_TINY) {
                PFindex.push_back(index);
                PFvalue.push_back(value * pivotX);
            }
        }
        PFpivotIndex.push_back(iRow[cp]);
        FtotalX += PFindex.size() - PFstart.back() + 1;
        UtotalX += PFindex.size() - PFstart.back();
        PFstart.push_back(PFindex.size());

        // 8. Update the sorted ep
        sorted_pp.push_back(make_pair(pLogic[cp], cp));
        sort(sorted_pp.begin(), sorted_pp.end());
    }

    // Now modify the U matrix
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Delete pivotal row from U
        int cIndex = iRow[cp];
        int cLogic = pLogic[cp];
        FtotalX -= URlastp[cLogic] - URstart[cLogic];
        UtotalX -= URlastp[cLogic] - URstart[cLogic];
        for (int k = URstart[cLogic]; k < URlastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[URindex[k]];
            int iFind = Ustart[iLogic];
            int iLast = --Ulastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (Uindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            Uindex[iFind] = Uindex[iLast];
            Uvalue[iFind] = Uvalue[iLast];
        }

        // 2. Delete pivotal column from UR
        FtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        UtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        for (int k = Ustart[cLogic]; k < Ulastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[Uindex[k]];
            int iFind = URstart[iLogic];
            int iLast = --URlastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (URindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            URspace[iLogic]++;
            URindex[iFind] = URindex[iLast];
            URvalue[iFind] = URvalue[iLast];
        }

        // 3. Insert the (stored) partial FTRAN to the row matrix
        int UstartX = Tstart[cp];
        int UendX = Tstart[cp + 1];
        FtotalX += UendX - UstartX + 1;
        UtotalX += UendX - UstartX;
        // Store column as UR elements
        for (int k = UstartX; k < UendX; k++) {
            // Which ETA file
            int iLogic = UpivotLookup[Uindex[k]];

            // Move row to the end if necessary
            if (URspace[iLogic] == 0) {
                // Make pointers
                int row_start = URstart[iLogic];
                int row_count = URlastp[iLogic] - row_start;
                int new_start = URindex.size();
                int new_space = row_count * 1.1 + 5;

                // Check matrix UR
                URindex.resize(new_start + new_space);
                URvalue.resize(new_start + new_space);

                // Move elements
                int iFrom = row_start;
                int iEnd = row_start + row_count;
                int iTo = new_start;
                copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
                copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

                // Save new pointers
                URstart[iLogic] = new_start;
                URlastp[iLogic] = new_start + row_count;
                URspace[iLogic] = new_space - row_count;
            }

            // Put into the next available space
            URspace[iLogic]--;
            int iPut = URlastp[iLogic]++;
            URindex[iPut] = cIndex;
            URvalue[iPut] = Uvalue[k];
        }

        // 4. Save pointers
        Ustart.push_back(UstartX);
        Ulastp.push_back(UendX);

        URstart.push_back(URstart[cLogic]);
        URlastp.push_back(URstart[cLogic]);
        URspace.push_back(URspace[cLogic] + URlastp[cLogic] - URstart[cLogic]);

        UpivotLookup[cIndex] = UpivotIndex.size();
        UpivotIndex[cLogic] = -1;
        UpivotIndex.push_back(cIndex);
        UpivotValue.push_back(Tpivot[cp]);
    }

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;

}